

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  atomic<unsigned_long> *paVar1;
  uint uVar2;
  uint uVar3;
  pointer pTVar4;
  double dVar5;
  pointer puVar6;
  pointer pfVar7;
  element_type *peVar8;
  bool bVar9;
  int iVar10;
  uint32_t matches;
  uint32_t gap;
  ostream *poVar11;
  pointer pOVar12;
  ulong uVar13;
  pointer puVar14;
  ulong uVar15;
  int iVar16;
  char **__args;
  pointer this;
  char *pcVar17;
  Overlap *jt;
  pointer pOVar18;
  long lVar19;
  char local_1e2;
  bool minhash;
  __atomic_base<unsigned_int> local_1e0;
  __allocator_type __a2;
  Parser<biosoup::NucleicAcid> *local_1d0;
  undefined4 local_1c4;
  undefined4 local_1c0;
  uint32_t num_threads;
  vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
  targets;
  uint32_t local_1a0;
  long *local_198;
  vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_> local_190;
  Timer timer;
  vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
  sequences;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  input_paths;
  vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
  futures;
  double local_100;
  packaged_task<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()> local_f8;
  shared_ptr<thread_pool::ThreadPool> thread_pool;
  __shared_ptr<std::packaged_task<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()>,_(__gnu_cxx::_Lock_policy)2>
  local_d8;
  ProgressBar bar;
  __shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2> local_90;
  MinimizerEngine minimizer_engine;
  
  minhash = false;
  input_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  input_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  input_paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c4 = 0xf;
  local_1c0 = 5;
  local_1e0._M_i = 500;
  local_1a0 = 4;
  matches = 100;
  gap = 10000;
  local_100 = 0.001;
  iVar16 = 1;
  while( true ) {
    iVar10 = getopt_long(argc,argv,"k:w:f:t:h",(anonymous_namespace)::options,0);
    if (iVar10 << 0x18 == -0x1000000) break;
    iVar10 = (iVar10 << 0x18) >> 0x18;
    switch(iVar10) {
    case 0x62:
      local_1e0._M_i = atoi(_optarg);
      break;
    case 99:
      local_1a0 = atoi(_optarg);
      break;
    case 100:
    case 0x65:
    case 0x69:
    case 0x6a:
    case 0x6c:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x75:
      goto switchD_00104742_caseD_64;
    case 0x66:
      local_100 = atof(_optarg);
      break;
    case 0x67:
      gap = atoi(_optarg);
      break;
    case 0x68:
      goto switchD_00104742_caseD_68;
    case 0x6b:
      local_1c4 = atoi(_optarg);
      break;
    case 0x6d:
      matches = atoi(_optarg);
      break;
    case 0x74:
      atoi(_optarg);
      break;
    case 0x76:
      poVar11 = std::operator<<((ostream *)&std::cout,"2.2.0");
      std::endl<char,std::char_traits<char>>(poVar11);
      goto LAB_00104822;
    case 0x77:
      local_1c0 = atoi(_optarg);
      break;
    default:
      if (iVar10 != 0x4d) goto switchD_00104742_caseD_64;
      minhash = true;
    }
  }
  if (argc == 1) {
switchD_00104742_caseD_68:
    anon_unknown.dwarf_1ab3b::Help();
LAB_00104822:
    iVar16 = 0;
    goto switchD_00104742_caseD_64;
  }
  lVar19 = (long)_optind;
  __args = argv + lVar19;
  for (; lVar19 < argc; lVar19 = lVar19 + 1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&input_paths,
               __args);
    __args = __args + 1;
  }
  if (input_paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      input_paths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar11 = std::operator<<((ostream *)&std::cerr,"[ram::] error: missing target file");
    std::endl<char,std::char_traits<char>>(poVar11);
    goto switchD_00104742_caseD_64;
  }
  anon_unknown.dwarf_1ab3b::CreateParser
            ((anon_unknown_dwarf_1ab3b *)&local_198,
             input_paths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_198 == (long *)0x0) {
    iVar16 = 1;
    goto switchD_00104742_caseD_64;
  }
  local_1e2 = '\0';
  if ((ulong)((long)input_paths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)input_paths.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    anon_unknown.dwarf_1ab3b::CreateParser
              ((anon_unknown_dwarf_1ab3b *)&minimizer_engine,
               input_paths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_1d0 = (Parser<biosoup::NucleicAcid> *)minimizer_engine._0_8_;
    local_1e2 = true;
LAB_00104941:
    std::make_shared<thread_pool::ThreadPool,unsigned_int&>((uint *)&thread_pool);
    std::__shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_90,
               &thread_pool.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>)
    ;
    ram::MinimizerEngine::MinimizerEngine
              (&minimizer_engine,(shared_ptr<thread_pool::ThreadPool> *)&local_90,local_1c4,
               local_1c0,local_1e0._M_i,local_1a0,matches,gap);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    timer.checkpoint_.__d.__r = (duration)0;
    timer.elapsed_time_ = 0.0;
    do {
      timer.checkpoint_.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      targets.
      super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      targets.
      super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      targets.
      super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (**(code **)(*local_198 + 0x10))(&bar,local_198,0x100000000,1);
      std::
      vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
      ::_M_move_assign(&targets,&bar);
      std::
      vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
      ::~vector((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                 *)&bar);
      if (targets.
          super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          targets.
          super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ::~vector(&targets);
        goto LAB_00105194;
      }
      poVar11 = std::operator<<((ostream *)&std::cerr,"[ram::] parsed ");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11," targets ");
      *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
           *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xfffffefb | 4;
      dVar5 = biosoup::Timer::Stop(&timer);
      poVar11 = std::ostream::_M_insert<double>(dVar5);
      poVar11 = std::operator<<(poVar11,"s");
      std::endl<char,std::char_traits<char>>(poVar11);
      timer.checkpoint_.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      ram::MinimizerEngine::Minimize
                (&minimizer_engine,
                 (const_iterator)
                 targets.
                 super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (const_iterator)
                 targets.
                 super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,minhash);
      ram::MinimizerEngine::Filter(&minimizer_engine,local_100);
      poVar11 = std::operator<<((ostream *)&std::cerr,"[ram::] minimized targets ");
      *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
           *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xfffffefb | 4;
      dVar5 = biosoup::Timer::Stop(&timer);
      poVar11 = std::ostream::_M_insert<double>(dVar5);
      poVar11 = std::operator<<(poVar11,"s");
      std::endl<char,std::char_traits<char>>(poVar11);
      local_1e0 = biosoup::NucleicAcid::num_objects.super___atomic_base<unsigned_int>._M_i;
      LOCK();
      biosoup::NucleicAcid::num_objects.super___atomic_base<unsigned_int>._M_i =
           (__atomic_base<unsigned_int>)0;
      UNLOCK();
      do {
        timer.checkpoint_.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        sequences.
        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sequences.
        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sequences.
        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (*local_1d0->_vptr_Parser[2])(&bar,local_1d0,0x40000000,1);
        std::
        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ::_M_move_assign(&sequences,&bar);
        std::
        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ::~vector((vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                   *)&bar);
        puVar6 = sequences.
                 super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (sequences.
            super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            sequences.
            super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
          ::~vector(&sequences);
          goto LAB_00105152;
        }
        futures.
        super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        futures.
        super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        futures.
        super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        puVar14 = sequences.
                  super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        while( true ) {
          peVar8 = thread_pool.
                   super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (puVar14 == puVar6) break;
          if ((local_1e2 != '\x01') ||
             (((puVar14->_M_t).
               super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
               ._M_t.
               super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
               .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl)->id <
              local_1e0._M_i)) {
            bar.bar_._M_dataplus._M_p = (pointer)&minimizer_engine;
            bar.bar_._M_string_length = (size_type)&local_1e2;
            bar.bar_.field_2._M_allocated_capacity = (size_type)&minhash;
            bar.bar_.field_2._8_8_ = puVar14;
            pOVar12 = (pointer)std::
                               allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<std::packaged_task<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()>,_std::allocator<std::packaged_task<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                               ::allocate((allocator_type *)&__a2,1);
            pOVar12->lhs_end = 1;
            pOVar12->rhs_id = 1;
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&pOVar12->lhs_id)->
            _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0011a7a8;
            local_190.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)&__a2;
            local_190.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
            _M_impl.super__Vector_impl_data._M_finish = pOVar12;
            std::
            __create_task_state<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>(),std::_Bind<main::__0(std::reference_wrapper<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const>)>,std::allocator<int>>
                      ((_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_lbcb_sci[P]ram_src_main_cpp:241:13)_(std::reference_wrapper<const_std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>)>
                        *)&pOVar12->rhs_begin,(allocator<int> *)&bar);
            local_190.super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_d8._M_ptr = (element_type *)&pOVar12->rhs_begin;
            local_d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pOVar12;
            std::
            __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::packaged_task<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()>,_std::allocator<std::packaged_task<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
            ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::packaged_task<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()>,_std::allocator<std::packaged_task<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                                *)&local_190);
            std::packaged_task<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()>
            ::get_future(&local_f8);
            std::
            __shared_ptr<std::packaged_task<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()>,_(__gnu_cxx::_Lock_policy)2>
            ::__shared_ptr((__shared_ptr<std::packaged_task<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()>,_(__gnu_cxx::_Lock_policy)2>
                            *)&local_190,&local_d8);
            LOCK();
            paVar1 = &peVar8->task_id_;
            uVar15 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
            (paVar1->super___atomic_base<unsigned_long>)._M_i =
                 (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
            UNLOCK();
            lVar19 = 0;
            while( true ) {
              pTVar4 = (peVar8->queues_).
                       super__Vector_base<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar13 = ((long)(peVar8->queues_).
                              super__Vector_base<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4) / 0xb0;
              if (lVar19 == uVar13 * 0x2a) break;
              uVar13 = (uVar15 + lVar19) % uVar13;
              bar.bar_._M_dataplus._M_p = (pointer)&pTVar4[uVar13].mutex;
              bVar9 = std::mutex::try_lock((mutex *)bar.bar_._M_dataplus._M_p);
              bar.bar_._M_string_length = CONCAT71(bar.bar_._M_string_length._1_7_,bVar9);
              if (bVar9) {
                std::
                queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
                ::
                emplace<thread_pool::ThreadPool::Submit<main::__0,std::reference_wrapper<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const>>(main::__0&&,std::reference_wrapper<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const>&&)::_lambda()_1_&>
                          ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
                            *)(pTVar4 + uVar13),(anon_class_16_1_8991e283 *)&local_190);
                goto LAB_00104d7f;
              }
              std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&bar);
              lVar19 = lVar19 + 1;
            }
            uVar15 = uVar15 % uVar13;
            std::unique_lock<std::mutex>::unique_lock
                      ((unique_lock<std::mutex> *)&bar,&pTVar4[uVar15].mutex);
            std::
            queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
            ::
            emplace<thread_pool::ThreadPool::Submit<main::__0,std::reference_wrapper<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const>>(main::__0&&,std::reference_wrapper<std::unique_ptr<biosoup::NucleicAcid,std::default_delete<biosoup::NucleicAcid>>const>&&)::_lambda()_1_&>
                      ((queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>
                        *)(pTVar4 + uVar15),(anon_class_16_1_8991e283 *)&local_190);
LAB_00104d7f:
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&bar);
            std::condition_variable::notify_one();
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_190.
                        super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
            std::
            vector<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>,std::allocator<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>>>
            ::
            emplace_back<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>>
                      ((vector<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>,std::allocator<std::future<std::vector<biosoup::Overlap,std::allocator<biosoup::Overlap>>>>>
                        *)&futures,
                       (future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_> *)
                       &local_f8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_f8._M_state.
                        super___shared_ptr<std::__future_base::_Task_state_base<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_()>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
          puVar14 = puVar14 + 1;
        }
        biosoup::ProgressBar::ProgressBar
                  (&bar,(uint32_t)
                        ((ulong)((long)futures.
                                       super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)futures.
                                      super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4),0x10);
        pfVar7 = futures.
                 super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar2 = (((targets.
                   super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
                 .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl)->id;
        uVar3 = (((sequences.
                   super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
                 .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>._M_head_impl)->id;
        for (this = futures.
                    super__Vector_base<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; this != pfVar7; this = this + 1) {
          std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>::get
                    (&local_190,this);
          pOVar12 = local_190.
                    super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          for (pOVar18 = local_190.
                         super__Vector_base<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>.
                         _M_impl.super__Vector_impl_data._M_start; pOVar18 != pOVar12;
              pOVar18 = pOVar18 + 1) {
            poVar11 = std::operator<<((ostream *)&std::cout,
                                      (string *)
                                      &(sequences.
                                        super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start
                                        [(ulong)*(uint *)&((
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                  &pOVar18->lhs_id)->_vptr__Sp_counted_base -
                                         (ulong)uVar3]._M_t.
                                        super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
                                        .super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>.
                                       _M_head_impl)->name);
            poVar11 = std::operator<<(poVar11,"\t");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            poVar11 = std::operator<<(poVar11,"\t");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            poVar11 = std::operator<<(poVar11,"\t");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            poVar11 = std::operator<<(poVar11,"\t");
            pcVar17 = "-";
            if (pOVar18->strand != false) {
              pcVar17 = "+";
            }
            poVar11 = std::operator<<(poVar11,pcVar17);
            poVar11 = std::operator<<(poVar11,"\t");
            poVar11 = std::operator<<(poVar11,(string *)
                                              &(targets.
                                                super__Vector_base<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start
                                                [(ulong)pOVar18->rhs_id - (ulong)uVar2]._M_t.
                                                super___uniq_ptr_impl<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_biosoup::NucleicAcid_*,_std::default_delete<biosoup::NucleicAcid>_>
                                                .
                                                super__Head_base<0UL,_biosoup::NucleicAcid_*,_false>
                                               ._M_head_impl)->name);
            poVar11 = std::operator<<(poVar11,"\t");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            poVar11 = std::operator<<(poVar11,"\t");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            poVar11 = std::operator<<(poVar11,"\t");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            poVar11 = std::operator<<(poVar11,"\t");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            poVar11 = std::operator<<(poVar11,"\t");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            poVar11 = std::operator<<(poVar11,"\t");
            poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0xff);
            std::endl<char,std::char_traits<char>>(poVar11);
          }
          std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>::~vector(&local_190);
          bVar9 = biosoup::ProgressBar::operator++(&bar);
          if (bVar9) {
            poVar11 = std::operator<<((ostream *)&std::cerr,"[ram::] mapped ");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            poVar11 = std::operator<<(poVar11," sequences ");
            poVar11 = std::operator<<(poVar11,"[");
            poVar11 = std::operator<<(poVar11,(string *)&bar);
            poVar11 = std::operator<<(poVar11,"] ");
            *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) =
                 *(uint *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x18) & 0xfffffefb | 4;
            dVar5 = biosoup::Timer::Lap(&timer);
            poVar11 = std::ostream::_M_insert<double>(dVar5);
            poVar11 = std::operator<<(poVar11,"s");
            std::operator<<(poVar11,"\r");
          }
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        biosoup::Timer::Stop(&timer);
        if ((local_1e2 != '\x01') ||
           (iVar16 = 0xb,
           (uint)biosoup::NucleicAcid::num_objects.super___atomic_base<unsigned_int>._M_i <
           local_1e0._M_i)) {
          iVar16 = 0;
        }
        std::__cxx11::string::~string((string *)&bar);
        std::
        vector<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>,_std::allocator<std::future<std::vector<biosoup::Overlap,_std::allocator<biosoup::Overlap>_>_>_>_>
        ::~vector(&futures);
        std::
        vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
        ::~vector(&sequences);
      } while (iVar16 == 0);
      if (iVar16 == 0xb) {
LAB_00105152:
        bioparser::Parser<biosoup::NucleicAcid>::Reset(local_1d0);
        LOCK();
        biosoup::NucleicAcid::num_objects.super___atomic_base<unsigned_int>._M_i =
             (__atomic_base<unsigned_int>)(__atomic_base<unsigned_int>)local_1e0._M_i;
        UNLOCK();
        iVar16 = 0;
      }
      std::
      vector<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>,_std::allocator<std::unique_ptr<biosoup::NucleicAcid,_std::default_delete<biosoup::NucleicAcid>_>_>_>
      ::~vector(&targets);
    } while (iVar16 == 0);
    if (iVar16 == 9) {
LAB_00105194:
      std::operator<<((ostream *)&std::cerr,"[ram::] ");
      poVar11 = std::ostream::_M_insert<double>(timer.elapsed_time_);
      poVar11 = std::operator<<(poVar11,"s");
      std::endl<char,std::char_traits<char>>(poVar11);
    }
    iVar16 = 0;
    ram::MinimizerEngine::~MinimizerEngine(&minimizer_engine);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&thread_pool.super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (local_1d0 != (Parser<biosoup::NucleicAcid> *)0x0) {
      (*local_1d0->_vptr_Parser[1])();
    }
  }
  else {
    anon_unknown.dwarf_1ab3b::CreateParser
              ((anon_unknown_dwarf_1ab3b *)&minimizer_engine,
               input_paths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    if (minimizer_engine._0_8_ != 0) {
      local_1d0 = (Parser<biosoup::NucleicAcid> *)minimizer_engine._0_8_;
      local_1e2 = std::operator==(input_paths.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  input_paths.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1);
      goto LAB_00104941;
    }
    iVar16 = 1;
  }
  if (local_198 != (long *)0x0) {
    (**(code **)(*local_198 + 8))();
  }
switchD_00104742_caseD_64:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&input_paths);
  return iVar16;
}

Assistant:

int main(int argc, char** argv) {
  std::uint32_t k = 15;
  std::uint32_t w = 5;
  std::uint32_t bandwidth = 500;
  std::uint32_t chain = 4;
  std::uint32_t matches = 100;
  std::uint32_t gap = 10000;
  double frequency = 0.001;
  bool minhash = false;
  std::uint32_t num_threads = 1;

  std::vector<std::string> input_paths;

  const char* optstr = "k:w:f:t:h";
  char arg;
  while ((arg = getopt_long(argc, argv, optstr, options, nullptr)) != -1) {
    switch (arg) {
      case 'k': k = std::atoi(optarg); break;
      case 'w': w = std::atoi(optarg); break;
      case 'b': bandwidth = std::atoi(optarg); break;
      case 'c': chain = std::atoi(optarg); break;
      case 'm': matches = std::atoi(optarg); break;
      case 'g': gap = std::atoi(optarg); break;
      case 'f': frequency = std::atof(optarg); break;
      case 'M': minhash = true; break;
      case 't': num_threads = std::atoi(optarg); break;
      case 'v': std::cout << VERSION << std::endl; return 0;
      case 'h': Help(); return 0;
      default: return 1;
    }
  }

  if (argc == 1) {
    Help();
    return 0;
  }

  for (auto i = optind; i < argc; ++i) {
    input_paths.emplace_back(argv[i]);
  }

  if (input_paths.empty()) {
    std::cerr << "[ram::] error: missing target file" << std::endl;
    return 1;
  }

  auto tparser = CreateParser(input_paths[0]);
  if (tparser == nullptr) {
    return 1;
  }

  bool is_ava = false;
  std::unique_ptr<bioparser::Parser<biosoup::NucleicAcid>> sparser = nullptr;
  if (input_paths.size() > 1) {
    sparser = CreateParser(input_paths[1]);
    if (sparser == nullptr) {
      return 1;
    }
    is_ava = input_paths[0] == input_paths[1];
  } else {
    sparser = CreateParser(input_paths[0]);
    is_ava = true;
  }

  auto thread_pool = std::make_shared<thread_pool::ThreadPool>(num_threads);
  ram::MinimizerEngine minimizer_engine{
      thread_pool,
      k,
      w,
      bandwidth,
      chain,
      matches,
      gap};

  biosoup::Timer timer{};

  while (true) {
    timer.Start();

    std::vector<std::unique_ptr<biosoup::NucleicAcid>> targets;
    try {
      targets = tparser->Parse(1ULL << 32);
    } catch (std::invalid_argument& exception) {
      std::cerr << exception.what() << std::endl;
      return 1;
    }

    if (targets.empty()) {
      break;
    }

    std::cerr << "[ram::] parsed " << targets.size() << " targets "
              << std::fixed << timer.Stop() << "s"
              << std::endl;

    timer.Start();

    minimizer_engine.Minimize(targets.begin(), targets.end(), minhash);
    minimizer_engine.Filter(frequency);

    std::cerr << "[ram::] minimized targets "
              << std::fixed << timer.Stop() << "s"
              << std::endl;

    std::uint64_t num_targets = biosoup::NucleicAcid::num_objects;
    biosoup::NucleicAcid::num_objects = 0;

    while (true) {
      timer.Start();

      std::vector<std::unique_ptr<biosoup::NucleicAcid>> sequences;
      try {
        sequences = sparser->Parse(1U << 30);
      } catch (std::invalid_argument& exception) {
        std::cerr << exception.what() << std::endl;
        return 1;
      }

      if (sequences.empty()) {
        break;
      }

      std::vector<std::future<std::vector<biosoup::Overlap>>> futures;
      for (const auto& it : sequences) {
        if (is_ava && it->id >= num_targets) {
          continue;
        }
        futures.emplace_back(thread_pool->Submit(
            [&] (const std::unique_ptr<biosoup::NucleicAcid>& sequence)
                -> std::vector<biosoup::Overlap> {
              return minimizer_engine.Map(sequence, is_ava, is_ava, minhash);
            },
            std::ref(it)));
      }

      biosoup::ProgressBar bar{
          static_cast<std::uint32_t>(futures.size()), 16};

      std::uint64_t rhs_offset = targets.front()->id;
      std::uint64_t lhs_offset = sequences.front()->id;
      for (auto& it : futures) {
        for (const auto& jt : it.get()) {
          std::cout << sequences[jt.lhs_id - lhs_offset]->name << "\t"
                    << sequences[jt.lhs_id - lhs_offset]->inflated_len << "\t"
                    << jt.lhs_begin << "\t"
                    << jt.lhs_end << "\t"
                    << (jt.strand ? "+" : "-") << "\t"
                    << targets[jt.rhs_id - rhs_offset]->name << "\t"
                    << targets[jt.rhs_id - rhs_offset]->inflated_len << "\t"
                    << jt.rhs_begin << "\t"
                    << jt.rhs_end << "\t"
                    << jt.score << "\t"
                    << std::max(
                          jt.lhs_end - jt.lhs_begin,
                          jt.rhs_end - jt.rhs_begin) << "\t"
                    << 255
                    << std::endl;
        }

        if (++bar) {
          std::cerr << "[ram::] mapped " << bar.event_counter() << " sequences "
                    << "[" << bar << "] "
                    << std::fixed << timer.Lap() << "s"
                    << "\r";
        }
      }
      std::cerr << std::endl;
      timer.Stop();

      if (is_ava && biosoup::NucleicAcid::num_objects >= num_targets) {
        break;
      }
    }

    sparser->Reset();
    biosoup::NucleicAcid::num_objects = num_targets;
  }

  std::cerr << "[ram::] " << timer.elapsed_time() << "s" << std::endl;

  return 0;
}